

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O3

unique_ptr<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>_>
 dispatch_new_section<(pstore::repo::section_kind)0,pstore::repo::generic_section_creation_dispatcher>
           (generic_section_creation_dispatcher *dispatcher,
           not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> buffer)

{
  _func_int **pp_Var1;
  size_t __new_size;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  void *__buf;
  
  __new_size = pstore::repo::generic_section_creation_dispatcher::size_bytes
                         ((generic_section_creation_dispatcher *)buffer.ptr_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RDX,__new_size);
  pp_Var1 = (_func_int **)
            (in_RDX->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pp_Var1 != (_func_int **)0x0) {
    pstore::repo::generic_section_creation_dispatcher::write
              ((generic_section_creation_dispatcher *)buffer.ptr_,(int)pp_Var1,__buf,in_RCX);
    (dispatcher->super_section_creation_dispatcher)._vptr_section_creation_dispatcher = pp_Var1;
    return (__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
            )(__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
              )dispatcher;
  }
  pstore::assert_failed
            ("data != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/section_helper.hpp"
             ,0x23);
}

Assistant:

decltype (auto)
dispatch_new_section (Dispatcher const & dispatcher,
                      pstore::gsl::not_null<std::vector<std::uint8_t> *> const buffer) {
    buffer->resize (dispatcher.size_bytes ());
    auto * const data = buffer->data ();
    PSTORE_ASSERT (data != nullptr);
    dispatcher.write (data);

    using section_type = typename pstore::repo::enum_to_section_t<Kind>;

    // Use unique_ptr<> to ensure that the section_type object's destructor is called. Since
    // the memory is not owned by this object (it belongs to 'buffer'), the delete operation
    // will do nothing thanks to placement_delete<>.
    return std::unique_ptr<section_type const, placement_delete<section_type const>>{
        reinterpret_cast<section_type const *> (data), placement_delete<section_type const>{}};
}